

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowManager.cpp
# Opt level: O2

bool __thiscall gui::CWindowManager::Draw(CWindowManager *this,IFrameBuffer *fb,TRect *dirtyRect)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  TPoint TVar5;
  element_type *peVar6;
  bool bVar7;
  undefined1 in_R9B;
  TRect client;
  TRect TVar8;
  CImageDataPtr cursor;
  TRect local_38;
  
  TVar5 = (TPoint)(this->m_desktop).super___shared_ptr<gui::CWindow,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
  TVar8.p1 = TVar5;
  TVar8.p0 = *(TPoint *)((long)TVar5 + 0x720);
  bVar7 = DrawWindow((gui *)fb,(IFrameBuffer *)((TRect *)((long)TVar5 + 0x718))->p0,TVar8,
                     (CWindow *)0x0,(bool)in_R9B);
  if ((bVar7) || (this->m_mouseDirty == true)) {
    CCursor::GetCursor((CCursor *)&cursor);
    if (cursor.super___shared_ptr<gui::CImageData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      client.p1 = (TPoint)(this->m_desktop).
                          super___shared_ptr<gui::CWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      client.p0 = (this->m_oldMouseRect).p1;
      DrawWindow((gui *)fb,(IFrameBuffer *)(this->m_oldMouseRect).p0,client,(CWindow *)0x1,
                 (bool)in_R9B);
      uVar1 = (cursor.super___shared_ptr<gui::CImageData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_xh;
      uVar3 = (cursor.super___shared_ptr<gui::CImageData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_yh;
      local_38.p0.x = (this->m_mousePosition).x - uVar1;
      local_38.p0.y = (this->m_mousePosition).y - uVar3;
      uVar2 = (cursor.super___shared_ptr<gui::CImageData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_width;
      uVar4 = (cursor.super___shared_ptr<gui::CImageData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_height;
      local_38.p1.x = uVar2 + local_38.p0.x;
      local_38.p1.y = uVar4 + local_38.p0.y;
      CImageData::Draw(cursor.super___shared_ptr<gui::CImageData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       ,fb,local_38.p0.x,local_38.p0.y);
      TVar8 = TRect::Union(&this->m_oldMouseRect,&local_38);
      *dirtyRect = TVar8;
      this->m_mouseDirty = false;
      (this->m_oldMouseRect).p0 = local_38.p0;
      (this->m_oldMouseRect).p1 = local_38.p1;
    }
    if (bVar7) {
      peVar6 = (this->m_desktop).super___shared_ptr<gui::CWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      TVar5 = (peVar6->m_rect).p1;
      dirtyRect->p0 = (peVar6->m_rect).p0;
      dirtyRect->p1 = TVar5;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&cursor.super___shared_ptr<gui::CImageData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    bVar7 = true;
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool CWindowManager::Draw(IFrameBuffer &fb, TRect &dirtyRect) {
    auto dirty = DrawWindow(fb, m_desktop->GetRect(), *m_desktop.get(), false);
    if (!dirty && !m_mouseDirty) {
        return false;
    }

    // TODO: handle hotspot
    auto cursor = m_cursor->GetCursor();
    if (cursor) {
        // Clear the old pointer first
        DrawWindow(fb, m_oldMouseRect, *m_desktop.get(), true);

        // Draw the new pointer
        auto x = m_mousePosition.x - cursor->GetXHotspot();
        auto y = m_mousePosition.y - cursor->GetYHotspot();
        TRect rect(x, y, x + cursor->GetWidth(), y + cursor->GetHeight());

        cursor->Draw(fb, x, y);
        dirtyRect = TRect::Union(m_oldMouseRect, rect);
        m_mouseDirty = false;
        m_oldMouseRect = rect;
    }

    if (dirty) {
        dirtyRect = m_desktop->GetRect();
    }

    return true;
}